

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*&> __thiscall
kj::
HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
::find<capnp::_::(anonymous_namespace)::TestVat*>
          (HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
           *this,TestVat **key)

{
  Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*&> MVar1;
  ConnectionImpl **ppCVar2;
  HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
  local_28 [8];
  long local_20;
  
  HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
  ::
  find<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Entry,capnp::_::(anonymous_namespace)::TestVat*&>
            (local_28,*(ArrayPtr<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
                        *)(key + 6),(TestVat **)*key);
  if (local_28[0] ==
      (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
       )0x1) {
    MVar1.ptr = (ConnectionImpl **)(&(*key)->super_TestVatBase + local_20 * 2);
  }
  else {
    MVar1.ptr = (ConnectionImpl **)0x0;
  }
  ppCVar2 = MVar1.ptr + 1;
  if (MVar1.ptr == (ConnectionImpl **)0x0) {
    ppCVar2 = (ConnectionImpl **)0x0;
  }
  *(ConnectionImpl ***)this = ppCVar2;
  return (Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}